

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O1

FILE * sunOpenLogFile(char *fname,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 *puVar3;
  
  iVar1 = strcmp(fname,"stdout");
  if (iVar1 == 0) {
    puVar3 = (undefined8 *)&stdout;
  }
  else {
    iVar1 = strcmp(fname,"stderr");
    if (iVar1 != 0) {
      pFVar2 = fopen(fname,"w+");
      return (FILE *)pFVar2;
    }
    puVar3 = (undefined8 *)&stderr;
  }
  return (FILE *)*puVar3;
}

Assistant:

static FILE* sunOpenLogFile(const char* fname, const char* mode)
{
  FILE* fp = NULL;

  if (fname)
  {
    if (!strcmp(fname, "stdout")) { fp = stdout; }
    else if (!strcmp(fname, "stderr")) { fp = stderr; }
    else { fp = fopen(fname, mode); }
  }

  return fp;
}